

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_tracing_libapi.cpp
# Opt level: O0

ze_result_t zelTracerDestroy(zel_tracer_handle_t hTracer)

{
  zel_pfnTracerDestroy_t pfnDestroy;
  zel_tracer_handle_t hTracer_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    if (*(code **)(ze_lib::context + 0x30) == (code *)0x0) {
      hTracer_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
    }
    else {
      hTracer_local._4_4_ = (**(code **)(ze_lib::context + 0x30))(hTracer);
    }
  }
  else {
    hTracer_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hTracer_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zelTracerDestroy(
    zel_tracer_handle_t hTracer                 ///< [in][release] handle of tracer object to destroy
    )
{
    if(ze_lib::destruction)
        return ZE_RESULT_ERROR_UNINITIALIZED;
    auto pfnDestroy = ze_lib::context->zelTracingDdiTable.Tracer.pfnDestroy;
    if( nullptr == pfnDestroy )
        return ZE_RESULT_ERROR_UNINITIALIZED;

    return pfnDestroy( hTracer );
}